

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp.cpp
# Opt level: O0

bool duckdb::ChimpCompressionFun::TypeIsSupported(PhysicalType physical_type)

{
  PhysicalType physical_type_local;
  
  return (byte)(physical_type - FLOAT) < 2;
}

Assistant:

bool ChimpCompressionFun::TypeIsSupported(const PhysicalType physical_type) {
	switch (physical_type) {
	case PhysicalType::FLOAT:
	case PhysicalType::DOUBLE:
		return true;
	default:
		return false;
	}
}